

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plt-elf.c
# Opt level: O0

plt_lib plt_get_lib(plt_ctx ctx,char *name)

{
  char *ctx_00;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t __maxlen;
  size_t sVar4;
  undefined1 *puVar5;
  undefined1 auStack_88 [8];
  char *local_80;
  char *local_78;
  char *libname_1;
  size_t local_68;
  unsigned_long __vla_expr0;
  size_t local_58;
  size_t len;
  char *libname;
  link_map *lm;
  size_t sStack_38;
  int libc;
  size_t val_len;
  char *pcStack_28;
  plt_selector sel;
  char *val;
  char *name_local;
  plt_ctx ctx_local;
  
  puVar5 = auStack_88;
  if (name == (char *)0x0) {
    ctx_local = (plt_ctx)ctx->r_map;
  }
  else {
    pcStack_28 = (char *)0x0;
    val = name;
    name_local = (char *)ctx;
    val_len._4_4_ = plt_get_selector(name,&stack0xffffffffffffffd8);
    sStack_38 = strlen(pcStack_28);
    iVar1 = strcmp(pcStack_28,"c");
    lm._4_4_ = (uint)((iVar1 != 0 ^ 0xffU) & 1);
    for (libname = *(char **)(name_local + 8); ctx_00 = name_local, pcVar2 = pcStack_28,
        pcVar3 = libname, libname != (char *)0x0; libname = *(char **)(libname + 0x18)) {
      if (val_len._4_4_ == PLT_SEL_LIB) {
        *(undefined8 *)(puVar5 + -8) = 0x10d79e;
        pcVar2 = get_lib_name((plt_ctx)ctx_00,(plt_lib)pcVar3);
        pcVar3 = pcStack_28;
        len = (size_t)pcVar2;
        if (lm._4_4_ == 0) {
          __maxlen = sStack_38 + 8;
          pcVar2 = puVar5 + -(sStack_38 + 0x17 & 0xfffffffffffffff0);
          local_80 = pcVar2;
          local_68 = __maxlen;
          __vla_expr0 = (unsigned_long)puVar5;
          local_58 = __maxlen;
          pcVar2[-8] = '/';
          pcVar2[-7] = -0x28;
          pcVar2[-6] = '\x10';
          pcVar2[-5] = '\0';
          pcVar2[-4] = '\0';
          pcVar2[-3] = '\0';
          pcVar2[-2] = '\0';
          pcVar2[-1] = '\0';
          snprintf(pcVar2,__maxlen,"/lib%s.so",pcVar3);
          sVar4 = len;
          pcVar3 = local_80;
          pcVar2[-8] = '<';
          pcVar2[-7] = -0x28;
          pcVar2[-6] = '\x10';
          pcVar2[-5] = '\0';
          pcVar2[-4] = '\0';
          pcVar2[-3] = '\0';
          pcVar2[-2] = '\0';
          pcVar2[-1] = '\0';
          pcVar3 = strstr((char *)sVar4,pcVar3);
          if (pcVar3 != (char *)0x0) {
            ctx_local = (plt_ctx)libname;
          }
          libname_1._4_4_ = (uint)(pcVar3 != (char *)0x0);
          puVar5 = (undefined1 *)__vla_expr0;
          if (libname_1._4_4_ != 0) {
            return (plt_lib)ctx_local;
          }
        }
        else {
          *(undefined8 *)(puVar5 + -8) = 0x10d7b8;
          pcVar3 = strstr(pcVar2,"/libc.so");
          sVar4 = len;
          if (pcVar3 != (char *)0x0) {
            return (plt_lib)libname;
          }
          *(undefined8 *)(puVar5 + -8) = 0x10d7ce;
          pcVar3 = strstr((char *)sVar4,"/musl.so");
          if (pcVar3 != (char *)0x0) {
            return (plt_lib)libname;
          }
        }
      }
      else if ((val_len._4_4_ == PLT_SEL_NONE) || (val_len._4_4_ == PLT_SEL_FILE)) {
        *(undefined8 *)(puVar5 + -8) = 0x10d88c;
        pcVar2 = get_lib_name((plt_ctx)ctx_00,(plt_lib)pcVar3);
        pcVar3 = pcStack_28;
        local_78 = pcVar2;
        *(undefined8 *)(puVar5 + -8) = 0x10d89d;
        iVar1 = strcmp(pcVar3,pcVar2);
        if (iVar1 == 0) {
          return (plt_lib)libname;
        }
      }
      else if (val_len._4_4_ == PLT_SEL_SYM) {
        *(undefined8 *)(puVar5 + -8) = 0x10d8c9;
        sVar4 = get_offsets((plt_ctx)ctx_00,(plt_lib)pcVar3,pcVar2,(plt_offset **)0x0);
        if (sVar4 != 0) {
          return (plt_lib)libname;
        }
      }
    }
    ctx_local = (plt_ctx)0x0;
  }
  return (plt_lib)ctx_local;
}

Assistant:

plt_lib plt_get_lib(plt_ctx ctx, const char *name)
{
    if (!name)
        return ctx->r_map;

    const char *val = NULL;
    enum plt_selector sel = plt_get_selector(name, &val);
    size_t val_len = strlen(val);
    int libc = !strcmp(val, "c");

    for (struct link_map *lm = ctx->r_map; lm != NULL; lm = lm->l_next) {
        if (sel == PLT_SEL_LIB) {
            const char *libname = get_lib_name(ctx, lm);
            if (libc) {
                if (strstr(libname, "/libc.so")
                 || strstr(libname, "/musl.so"))
                    return lm;
            } else {
                size_t len = val_len + 8;
                char pattern[len];
                snprintf(pattern, len, "/lib%s.so", val);
                if (strstr(libname, pattern))
                    return lm;
            }
        } else if (sel == PLT_SEL_NONE || sel == PLT_SEL_FILE) {
            const char *libname = get_lib_name(ctx, lm);
            if (!strcmp(val, libname))
                return lm;
        } else if (sel == PLT_SEL_SYM) {
            if (get_offsets(ctx, lm, val, NULL) > 0)
                return lm;
        }
    }
    return NULL;
}